

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperMatch.c
# Opt level: O0

int Map_MatchNodePhase(Map_Man_t *p,Map_Node_t *pNode,int fPhase)

{
  int iVar1;
  Map_Match_t *pM2;
  long lVar2;
  float fVar3;
  float local_74;
  float fWorstLimit;
  float Area2;
  float Area1;
  Map_Cut_t *pCutBest;
  Map_Cut_t *pCut;
  Map_Match_t *pMatch;
  Map_Match_t MatchBest;
  int fPhase_local;
  Map_Node_t *pNode_local;
  Map_Man_t *p_local;
  
  _Area2 = pNode->pCutBest[fPhase];
  if ((p->fMappingMode == 0) || (_Area2 != (Map_Cut_t *)0x0)) {
    MatchBest.AreaFlow = (float)fPhase;
    if (p->fMappingMode != 0) {
      Map_TimeCutComputeArrival(pNode,_Area2,fPhase,3.4028235e+37);
    }
    if ((p->fMappingMode == 2) || (p->fMappingMode == 3)) {
      lVar2 = (long)(int)MatchBest.AreaFlow;
      if ((pNode->nRefAct[(int)MatchBest.AreaFlow] < 1) &&
         ((pNode->pCutBest[(int)(uint)((MatchBest.AreaFlow != 0.0 ^ 0xffU) & 1)] != (Map_Cut_t *)0x0
          || (pNode->nRefAct[(int)(uint)((MatchBest.AreaFlow != 0.0 ^ 0xffU) & 1)] < 1)))) {
        fVar3 = Map_CutGetAreaDerefed(_Area2,(int)MatchBest.AreaFlow);
        _Area2->M[lVar2].AreaFlow = fVar3;
      }
      else {
        fVar3 = Map_CutDeref(_Area2,(int)MatchBest.AreaFlow);
        _Area2->M[lVar2].AreaFlow = fVar3;
      }
    }
    else if (p->fMappingMode == 4) {
      lVar2 = (long)(int)MatchBest.AreaFlow;
      if ((pNode->nRefAct[(int)MatchBest.AreaFlow] < 1) &&
         ((pNode->pCutBest[(int)(uint)((MatchBest.AreaFlow != 0.0 ^ 0xffU) & 1)] != (Map_Cut_t *)0x0
          || (pNode->nRefAct[(int)(uint)((MatchBest.AreaFlow != 0.0 ^ 0xffU) & 1)] < 1)))) {
        fVar3 = Map_SwitchCutGetDerefed(pNode,_Area2,(int)MatchBest.AreaFlow);
        _Area2->M[lVar2].AreaFlow = fVar3;
      }
      else {
        fVar3 = Map_SwitchCutDeref(pNode,_Area2,(int)MatchBest.AreaFlow);
        _Area2->M[lVar2].AreaFlow = fVar3;
      }
    }
    if (_Area2 == (Map_Cut_t *)0x0) {
      Map_MatchClean((Map_Match_t *)&pMatch);
    }
    else {
      memcpy(&pMatch,_Area2->M + (int)MatchBest.AreaFlow,0x28);
    }
    local_74 = pNode->tRequired[(int)MatchBest.AreaFlow].Worst;
    for (pCutBest = pNode->pCuts->pNext; pCutBest != (Map_Cut_t *)0x0; pCutBest = pCutBest->pNext) {
      if (((p->fSkipFanout == 0) ||
          (((pNode->nRefs < 4 || (pCutBest->nLeaves < '\x03')) &&
           ((pNode->nRefs < 2 || (pCutBest->nLeaves < '\x04')))))) &&
         ((((pM2 = pCutBest->M + (int)MatchBest.AreaFlow, pM2->pSupers != (Map_Super_t *)0x0 &&
            (Map_MatchNodeCut(p,pNode,pCutBest,(int)MatchBest.AreaFlow,local_74),
            pM2->pSuperBest != (Map_Super_t *)0x0)) &&
           ((pM2->tArrive).Worst <= local_74 + p->fEpsilon)) &&
          (iVar1 = Map_MatchCompare(p,(Map_Match_t *)&pMatch,pM2,p->fMappingMode), iVar1 != 0)))) {
        _Area2 = pCutBest;
        memcpy(&pMatch,pM2,0x28);
        if (p->fMappingMode == 0) {
          local_74 = MatchBest.tArrive.Rise;
        }
      }
    }
    if (_Area2 != (Map_Cut_t *)0x0) {
      pNode->pCutBest[(int)MatchBest.AreaFlow] = _Area2;
      memcpy(_Area2->M + (int)MatchBest.AreaFlow,&pMatch,0x28);
      if ((1 < p->fMappingMode) &&
         ((0 < pNode->nRefAct[(int)MatchBest.AreaFlow] ||
          ((pNode->pCutBest[(int)(uint)((MatchBest.AreaFlow != 0.0 ^ 0xffU) & 1)] ==
            (Map_Cut_t *)0x0 &&
           (0 < pNode->nRefAct[(int)(uint)((MatchBest.AreaFlow != 0.0 ^ 0xffU) & 1)])))))) {
        if ((p->fMappingMode == 2) || (p->fMappingMode == 3)) {
          Map_CutRef(pNode->pCutBest[(int)MatchBest.AreaFlow],(int)MatchBest.AreaFlow);
        }
        else {
          if (p->fMappingMode != 4) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mapper/mapperMatch.c"
                          ,0x14d,"int Map_MatchNodePhase(Map_Man_t *, Map_Node_t *, int)");
          }
          Map_SwitchCutRef(pNode,pNode->pCutBest[(int)MatchBest.AreaFlow],(int)MatchBest.AreaFlow);
        }
      }
    }
  }
  return 1;
}

Assistant:

int Map_MatchNodePhase( Map_Man_t * p, Map_Node_t * pNode, int fPhase )
{
    Map_Match_t MatchBest, * pMatch;
    Map_Cut_t * pCut, * pCutBest;
    float Area1 = 0.0; // Suppress "might be used uninitialized
    float Area2, fWorstLimit;

    // skip the cuts that have been unassigned during area recovery
    pCutBest = pNode->pCutBest[fPhase];
    if ( p->fMappingMode != 0 && pCutBest == NULL )
        return 1;

    // recompute the arrival times of the current best match 
    // because the arrival times of the fanins may have changed 
    // as a result of remapping fanins in the topological order
    if ( p->fMappingMode != 0 )
    {
        Map_TimeCutComputeArrival( pNode, pCutBest, fPhase, MAP_FLOAT_LARGE );
        // make sure that the required times are met
//        assert( pCutBest->M[fPhase].tArrive.Rise < pNode->tRequired[fPhase].Rise + p->fEpsilon );
//        assert( pCutBest->M[fPhase].tArrive.Fall < pNode->tRequired[fPhase].Fall + p->fEpsilon );
    }

    // recompute the exact area of the current best match
    // because the exact area of the fanins may have changed
    // as a result of remapping fanins in the topological order
    if ( p->fMappingMode == 2 || p->fMappingMode == 3 )
    {
        pMatch = pCutBest->M + fPhase;
        if ( pNode->nRefAct[fPhase] > 0 || 
            (pNode->pCutBest[!fPhase] == NULL && pNode->nRefAct[!fPhase] > 0) )
            pMatch->AreaFlow = Area1 = Map_CutDeref( pCutBest, fPhase );
        else
            pMatch->AreaFlow = Area1 = Map_CutGetAreaDerefed( pCutBest, fPhase );
    }
    else if ( p->fMappingMode == 4 )
    {
        pMatch = pCutBest->M + fPhase;
        if ( pNode->nRefAct[fPhase] > 0 || 
            (pNode->pCutBest[!fPhase] == NULL && pNode->nRefAct[!fPhase] > 0) )
            pMatch->AreaFlow = Area1 = Map_SwitchCutDeref( pNode, pCutBest, fPhase );
        else
            pMatch->AreaFlow = Area1 = Map_SwitchCutGetDerefed( pNode, pCutBest, fPhase );
    }

    // save the old mapping
    if ( pCutBest )
        MatchBest = pCutBest->M[fPhase];
    else
        Map_MatchClean( &MatchBest );
 
    // select the new best cut
    fWorstLimit = pNode->tRequired[fPhase].Worst;
    for ( pCut = pNode->pCuts->pNext; pCut; pCut = pCut->pNext )
    {
        // limit gate sizes based on fanout count
        if ( p->fSkipFanout && ((pNode->nRefs > 3 && pCut->nLeaves > 2) || (pNode->nRefs > 1 && pCut->nLeaves > 3)) )
            continue;
        pMatch = pCut->M + fPhase;
        if ( pMatch->pSupers == NULL )
            continue;

        // find the matches for the cut
        Map_MatchNodeCut( p, pNode, pCut, fPhase, fWorstLimit );
        if ( pMatch->pSuperBest == NULL || pMatch->tArrive.Worst > fWorstLimit + p->fEpsilon )
            continue;

        // if the cut can be matched compare the matchings
        if ( Map_MatchCompare( p, &MatchBest, pMatch, p->fMappingMode ) )
        {
            pCutBest  =  pCut;
            MatchBest = *pMatch;
            // if we are mapping for delay, the worst-case limit should be tightened
            if ( p->fMappingMode == 0 )
                fWorstLimit = MatchBest.tArrive.Worst;
        }
    }

    if ( pCutBest == NULL )
        return 1;

    // set the new mapping
    pNode->pCutBest[fPhase] = pCutBest;
    pCutBest->M[fPhase]     = MatchBest;

    // reference the new cut if it used
    if ( p->fMappingMode >= 2 && 
         (pNode->nRefAct[fPhase] > 0 || 
         (pNode->pCutBest[!fPhase] == NULL && pNode->nRefAct[!fPhase] > 0)) )
    {
        if ( p->fMappingMode == 2 || p->fMappingMode == 3 )
            Area2 = Map_CutRef( pNode->pCutBest[fPhase], fPhase );
        else if ( p->fMappingMode == 4 )
            Area2 = Map_SwitchCutRef( pNode, pNode->pCutBest[fPhase], fPhase );
        else 
            assert( 0 );
//        assert( Area2 < Area1 + p->fEpsilon );
    }

    // make sure that the requited times are met
//    assert( MatchBest.tArrive.Rise < pNode->tRequired[fPhase].Rise + p->fEpsilon );
//    assert( MatchBest.tArrive.Fall < pNode->tRequired[fPhase].Fall + p->fEpsilon );
    return 1;
}